

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::BeginFile
          (PythonGenerator *this,string *name_space_name,bool needs_imports,string *code_ptr,
          string *mod,ImportMap *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  long *plVar5;
  Parser *pPVar6;
  _Rb_tree_header *p_Var7;
  _Base_ptr p_Var8;
  size_type *psVar9;
  long *plVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_import;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  import_entry;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  PythonGenerator *local_e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  ImportMap *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_128 = &local_118;
  pcVar3 = (code_ptr->_M_dataplus)._M_p;
  local_e8 = this;
  local_60 = imports;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar3,pcVar3 + code_ptr->_M_string_length);
  std::__cxx11::string::append((char *)&local_128);
  BaseGenerator::FlatBuffersGeneratedWarning();
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
  paVar1 = &local_108.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_108.field_2._M_allocated_capacity = *psVar9;
    local_108.field_2._8_8_ = plVar5[3];
    local_108._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar9;
    local_108._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_108._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_58 = mod;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
  paVar2 = &local_e0.first.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e0.first.field_2._M_allocated_capacity = *psVar9;
    local_e0.first.field_2._8_8_ = plVar5[3];
    local_e0.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_e0.first.field_2._M_allocated_capacity = *psVar9;
    local_e0.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_e0.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)code_ptr,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  std::operator+(&local_108,"# namespace: ",name_space_name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e0.first.field_2._M_allocated_capacity = *psVar9;
    local_e0.first.field_2._8_8_ = plVar5[3];
    local_e0.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_e0.first.field_2._M_allocated_capacity = *psVar9;
    local_e0.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_e0.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_e0.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (needs_imports) {
    std::operator+(&local_108,".",local_58);
    std::__cxx11::string::append((char *)code_ptr);
    pPVar6 = (local_e8->super_BaseGenerator).parser_;
    if ((pPVar6->opts).python_gen_numpy == true) {
      std::__cxx11::string::append((char *)code_ptr);
      pPVar6 = (local_e8->super_BaseGenerator).parser_;
    }
    if ((pPVar6->opts).python_typing == true) {
      std::__cxx11::string::append((char *)code_ptr);
      p_Var8 = (local_60->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = &(local_60->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var8 != p_Var7) {
        do {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair(&local_e0,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(p_Var8 + 1));
          if (local_e0.first._M_string_length == local_108._M_string_length) {
            if (local_e0.first._M_string_length != 0) {
              iVar4 = bcmp(local_e0.first._M_dataplus._M_p,local_108._M_dataplus._M_p,
                           local_e0.first._M_string_length);
              if (iVar4 != 0) goto LAB_00298346;
            }
          }
          else {
LAB_00298346:
            std::operator+(&local_50,"from ",&local_e0.first);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_a0 = &local_90;
            plVar10 = plVar5 + 2;
            if ((long *)*plVar5 == plVar10) {
              local_90 = *plVar10;
              lStack_88 = plVar5[3];
            }
            else {
              local_90 = *plVar10;
              local_a0 = (long *)*plVar5;
            }
            local_98 = plVar5[1];
            *plVar5 = (long)plVar10;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_a0,(ulong)local_e0.second._M_dataplus._M_p);
            local_80 = &local_70;
            plVar10 = plVar5 + 2;
            if ((long *)*plVar5 == plVar10) {
              local_70 = *plVar10;
              lStack_68 = plVar5[3];
            }
            else {
              local_70 = *plVar10;
              local_80 = (long *)*plVar5;
            }
            local_78 = plVar5[1];
            *plVar5 = (long)plVar10;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
            local_128 = &local_118;
            plVar10 = plVar5 + 2;
            if ((long *)*plVar5 == plVar10) {
              local_118 = *plVar10;
              lStack_110 = plVar5[3];
            }
            else {
              local_118 = *plVar10;
              local_128 = (long *)*plVar5;
            }
            local_120 = plVar5[1];
            *plVar5 = (long)plVar10;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_128);
            if (local_128 != &local_118) {
              operator_delete(local_128,local_118 + 1);
            }
            if (local_80 != &local_70) {
              operator_delete(local_80,local_70 + 1);
            }
            if (local_a0 != &local_90) {
              operator_delete(local_a0,local_90 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
            operator_delete(local_e0.second._M_dataplus._M_p,
                            local_e0.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.first._M_dataplus._M_p != paVar2) {
            operator_delete(local_e0.first._M_dataplus._M_p,
                            local_e0.first.field_2._M_allocated_capacity + 1);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var7);
      }
    }
    if ((((local_e8->super_BaseGenerator).parser_)->opts).python_gen_numpy == true) {
      std::__cxx11::string::append((char *)code_ptr);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void BeginFile(const std::string &name_space_name, const bool needs_imports,
                 std::string *code_ptr, const std::string &mod,
                 const ImportMap &imports) const {
    auto &code = *code_ptr;
    code = code + "# " + FlatBuffersGeneratedWarning() + "\n\n";
    code += "# namespace: " + name_space_name + "\n\n";

    if (needs_imports) {
      const std::string local_import = "." + mod;

      code += "import flatbuffers\n";
      if (parser_.opts.python_gen_numpy) {
        code += "from flatbuffers.compat import import_numpy\n";
      }
      if (parser_.opts.python_typing) {
        code += "from typing import Any\n";

        for (auto import_entry : imports) {
          // If we have a file called, say, "MyType.py" and in it we have a
          // class "MyType", we can generate imports -- usually when we
          // have a type that contains arrays of itself -- of the type
          // "from .MyType import MyType", which Python can't resolve. So
          // if we are trying to import ourself, we skip.
          if (import_entry.first != local_import) {
            code += "from " + import_entry.first + " import " +
                    import_entry.second + "\n";
          }
        }
      }
      if (parser_.opts.python_gen_numpy) {
        code += "np = import_numpy()\n\n";
      }
    }
  }